

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlDrawRenderBatch(RenderBatch *batch)

{
  GLint GVar1;
  Matrix left;
  Matrix view;
  Matrix projection;
  Matrix left_00;
  Matrix mat;
  Matrix right;
  Matrix right_00;
  PFNGLUNIFORMMATRIX4FVPROC p_Var2;
  undefined8 uVar3;
  PFNGLDRAWELEMENTSPROC in_stack_fffffffffffffde8;
  int local_1ec;
  int local_1e8;
  int i_3;
  int i_2;
  int vertexOffset;
  int i_1;
  int i;
  Matrix matMVP;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  int local_94;
  int eye;
  int eyesCount;
  Matrix matModelView;
  Matrix matProjection;
  RenderBatch *batch_local;
  
  if (0 < batch->vertexBuffer[batch->currentBuffer].vCounter) {
    if (RLGL.ExtSupported.vao) {
      (*glad_glBindVertexArray)(batch->vertexBuffer[batch->currentBuffer].vaoId);
    }
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[0]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)(batch->vertexBuffer[batch->currentBuffer].vCounter * 3) << 2,
               batch->vertexBuffer[batch->currentBuffer].vertices);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[1]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)(batch->vertexBuffer[batch->currentBuffer].vCounter << 1) << 2,
               batch->vertexBuffer[batch->currentBuffer].texcoords);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[2]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)(batch->vertexBuffer[batch->currentBuffer].vCounter << 2),
               batch->vertexBuffer[batch->currentBuffer].colors);
    if ((RLGL.ExtSupported.vao & 1U) != 0) {
      (*glad_glBindVertexArray)(0);
    }
  }
  memcpy(&matModelView.m11,&RLGL.State.projection,0x40);
  memcpy(&eye,&RLGL.State.modelview,0x40);
  local_94 = 1;
  if ((RLGL.State.stereoRender & 1U) != 0) {
    local_94 = 2;
  }
  for (local_98 = 0; local_98 < local_94; local_98 = local_98 + 1) {
    if (local_94 == 2) {
      rlViewport((local_98 * RLGL.State.framebufferWidth) / 2,0,RLGL.State.framebufferWidth / 2,
                 RLGL.State.framebufferHeight);
      memcpy(&local_118,RLGL.State.viewOffsetStereo + local_98,0x40);
      left.m8 = matModelView.m8;
      left.m12 = matModelView.m12;
      left.m0 = matModelView.m0;
      left.m4 = matModelView.m4;
      left.m1 = matModelView.m1;
      left.m5 = matModelView.m5;
      left.m9 = matModelView.m9;
      left.m13 = matModelView.m13;
      left.m2 = matModelView.m2;
      left.m6 = matModelView.m6;
      left.m10 = matModelView.m10;
      left.m14 = matModelView.m14;
      left.m3 = matModelView.m3;
      left.m7 = matModelView.m7;
      left.m11 = (float)(undefined4)local_118;
      left.m15 = (float)local_118._4_4_;
      right.m8 = (float)(undefined4)local_108;
      right.m12 = (float)local_108._4_4_;
      right.m0 = (float)(undefined4)uStack_110;
      right.m4 = (float)uStack_110._4_4_;
      right.m1 = (float)(undefined4)uStack_100;
      right.m5 = (float)uStack_100._4_4_;
      right.m9 = (float)(undefined4)local_f8;
      right.m13 = (float)local_f8._4_4_;
      right.m2 = (float)(undefined4)uStack_f0;
      right.m6 = (float)uStack_f0._4_4_;
      right.m10 = (float)(undefined4)local_e8;
      right.m14 = (float)local_e8._4_4_;
      right.m3 = (float)(undefined4)uStack_e0;
      right.m7 = (float)uStack_e0._4_4_;
      right._56_8_ = in_stack_fffffffffffffde8;
      uVar3 = local_118;
      MatrixMultiply(left,right);
      view.m8 = (float)(undefined4)local_c8;
      view.m12 = (float)local_c8._4_4_;
      view.m0 = (float)(undefined4)uStack_d0;
      view.m4 = (float)uStack_d0._4_4_;
      view.m1 = (float)(undefined4)uStack_c0;
      view.m5 = (float)uStack_c0._4_4_;
      view.m9 = (float)(undefined4)local_b8;
      view.m13 = (float)local_b8._4_4_;
      view.m2 = (float)(undefined4)uStack_b0;
      view.m6 = (float)uStack_b0._4_4_;
      view.m10 = (float)(undefined4)local_a8;
      view.m14 = (float)local_a8._4_4_;
      view.m3 = (float)(undefined4)uStack_a0;
      view.m7 = (float)uStack_a0._4_4_;
      view.m11 = (float)(int)uVar3;
      view.m15 = (float)(int)((ulong)uVar3 >> 0x20);
      rlSetMatrixModelview(view);
      memcpy(&matMVP.m11,RLGL.State.projectionStereo + local_98,0x40);
      projection._8_8_ = local_148;
      projection._0_8_ = uStack_150;
      projection._16_8_ = uStack_140;
      projection._24_8_ = local_138;
      projection._32_8_ = uStack_130;
      projection._40_8_ = local_128;
      projection._48_8_ = uStack_120;
      projection.m11 = (float)(int)uVar3;
      projection.m15 = (float)(int)((ulong)uVar3 >> 0x20);
      rlSetMatrixProjection(projection);
    }
    if (0 < batch->vertexBuffer[batch->currentBuffer].vCounter) {
      (*glad_glUseProgram)(RLGL.State.currentShader.id);
      left_00.m8 = RLGL.State.modelview.m1;
      left_00.m12 = RLGL.State.modelview.m5;
      left_00.m0 = RLGL.State.modelview.m8;
      left_00.m4 = RLGL.State.modelview.m12;
      left_00.m1 = RLGL.State.modelview.m9;
      left_00.m5 = RLGL.State.modelview.m13;
      left_00.m9 = RLGL.State.modelview.m2;
      left_00.m13 = RLGL.State.modelview.m6;
      left_00.m2 = RLGL.State.modelview.m10;
      left_00.m6 = RLGL.State.modelview.m14;
      left_00.m10 = RLGL.State.modelview.m3;
      left_00.m14 = RLGL.State.modelview.m7;
      left_00.m3 = RLGL.State.modelview.m11;
      left_00.m7 = RLGL.State.modelview.m15;
      left_00.m11 = RLGL.State.projection.m0;
      left_00.m15 = RLGL.State.projection.m4;
      right_00.m8 = RLGL.State.projection.m1;
      right_00.m12 = RLGL.State.projection.m5;
      right_00.m0 = RLGL.State.projection.m8;
      right_00.m4 = RLGL.State.projection.m12;
      right_00.m1 = RLGL.State.projection.m9;
      right_00.m5 = RLGL.State.projection.m13;
      right_00.m9 = RLGL.State.projection.m2;
      right_00.m13 = RLGL.State.projection.m6;
      right_00.m2 = RLGL.State.projection.m10;
      right_00.m6 = RLGL.State.projection.m14;
      right_00.m10 = RLGL.State.projection.m3;
      right_00.m14 = RLGL.State.projection.m7;
      right_00.m3 = RLGL.State.projection.m11;
      right_00.m7 = RLGL.State.projection.m15;
      right_00._56_8_ = in_stack_fffffffffffffde8;
      uVar3 = RLGL.State.projection._0_8_;
      MatrixMultiply(left_00,right_00);
      p_Var2 = glad_glUniformMatrix4fv;
      GVar1 = RLGL.State.currentShader.locs[6];
      mat.m8 = matMVP.m8;
      mat.m12 = matMVP.m12;
      mat.m0 = matMVP.m0;
      mat.m4 = matMVP.m4;
      mat.m1 = matMVP.m1;
      mat.m5 = matMVP.m5;
      mat.m9 = matMVP.m9;
      mat.m13 = matMVP.m13;
      mat.m2 = matMVP.m2;
      mat.m6 = matMVP.m6;
      mat.m10 = matMVP.m10;
      mat.m14 = matMVP.m14;
      mat.m3 = matMVP.m3;
      mat.m7 = matMVP.m7;
      mat.m11 = (float)uVar3;
      mat.m15 = SUB84(uVar3,4);
      MatrixToFloatV(mat);
      (*p_Var2)(GVar1,1,'\0',(GLfloat *)&i_1);
      if ((RLGL.ExtSupported.vao & 1U) == 0) {
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[0]);
        (*glad_glVertexAttribPointer)(*RLGL.State.currentShader.locs,3,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(*RLGL.State.currentShader.locs);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[1]);
        (*glad_glVertexAttribPointer)(RLGL.State.currentShader.locs[1],2,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[1]);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[2]);
        (*glad_glVertexAttribPointer)
                  (RLGL.State.currentShader.locs[5],4,0x1401,'\x01',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[5]);
        (*glad_glBindBuffer)(0x8893,batch->vertexBuffer[batch->currentBuffer].vboId[3]);
      }
      else {
        (*glad_glBindVertexArray)(batch->vertexBuffer[batch->currentBuffer].vaoId);
      }
      (*glad_glUniform4f)(RLGL.State.currentShader.locs[0xc],1.0,1.0,1.0,1.0);
      (*glad_glUniform1i)(RLGL.State.currentShader.locs[0xf],0);
      for (vertexOffset = 0; vertexOffset < 4; vertexOffset = vertexOffset + 1) {
        if (RLGL.State.activeTextureId[vertexOffset] != 0) {
          (*glad_glActiveTexture)(vertexOffset + 0x84c1);
          (*glad_glBindTexture)(0xde1,RLGL.State.activeTextureId[vertexOffset]);
        }
      }
      (*glad_glActiveTexture)(0x84c0);
      i_3 = 0;
      for (i_2 = 0; i_2 < batch->drawsCounter; i_2 = i_2 + 1) {
        (*glad_glBindTexture)(0xde1,batch->draws[i_2].textureId);
        if ((batch->draws[i_2].mode == 1) || (batch->draws[i_2].mode == 4)) {
          (*glad_glDrawArrays)(batch->draws[i_2].mode,i_3,batch->draws[i_2].vertexCount);
        }
        else {
          in_stack_fffffffffffffde8 = glad_glDrawElements;
          (*glad_glDrawElements)
                    (4,(batch->draws[i_2].vertexCount / 4) * 6,0x1405,
                     (void *)((long)((i_3 / 4) * 6) << 2));
        }
        i_3 = batch->draws[i_2].vertexCount + batch->draws[i_2].vertexAlignment + i_3;
      }
      if ((RLGL.ExtSupported.vao & 1U) == 0) {
        (*glad_glBindBuffer)(0x8892,0);
        (*glad_glBindBuffer)(0x8893,0);
      }
      (*glad_glBindTexture)(0xde1,0);
    }
    if ((RLGL.ExtSupported.vao & 1U) != 0) {
      (*glad_glBindVertexArray)(0);
    }
    (*glad_glUseProgram)(0);
  }
  batch->vertexBuffer[batch->currentBuffer].vCounter = 0;
  batch->vertexBuffer[batch->currentBuffer].tcCounter = 0;
  batch->vertexBuffer[batch->currentBuffer].cCounter = 0;
  batch->currentDepth = -1.0;
  memcpy(&RLGL.State.projection,&matModelView.m11,0x40);
  memcpy(&RLGL.State.modelview,&eye,0x40);
  for (local_1e8 = 0; local_1e8 < 0x100; local_1e8 = local_1e8 + 1) {
    batch->draws[local_1e8].mode = 7;
    batch->draws[local_1e8].vertexCount = 0;
    batch->draws[local_1e8].textureId = RLGL.State.defaultTextureId;
  }
  for (local_1ec = 0; local_1ec < 4; local_1ec = local_1ec + 1) {
    RLGL.State.activeTextureId[local_1ec] = 0;
  }
  batch->drawsCounter = 1;
  batch->currentBuffer = batch->currentBuffer + 1;
  if (batch->buffersCount <= batch->currentBuffer) {
    batch->currentBuffer = 0;
  }
  return;
}

Assistant:

void rlDrawRenderBatch(RenderBatch *batch)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Update batch vertex buffers
    //------------------------------------------------------------------------------------------------------------
    // NOTE: If there is not vertex data, buffers doesn't need to be updated (vertexCount > 0)
    // TODO: If no data changed on the CPU arrays --> No need to re-update GPU arrays (change flag required)
    if (batch->vertexBuffer[batch->currentBuffer].vCounter > 0)
    {
        // Activate elements VAO
        if (RLGL.ExtSupported.vao) glBindVertexArray(batch->vertexBuffer[batch->currentBuffer].vaoId);

        // Vertex positions buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[0]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, batch->vertexBuffer[batch->currentBuffer].vCounter*3*sizeof(float), batch->vertexBuffer[batch->currentBuffer].vertices);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*3*4*batch->vertexBuffer[batch->currentBuffer].elementsCount, batch->vertexBuffer[batch->currentBuffer].vertices, GL_DYNAMIC_DRAW);  // Update all buffer

        // Texture coordinates buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[1]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, batch->vertexBuffer[batch->currentBuffer].vCounter*2*sizeof(float), batch->vertexBuffer[batch->currentBuffer].texcoords);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*2*4*batch->vertexBuffer[batch->currentBuffer].elementsCount, batch->vertexBuffer[batch->currentBuffer].texcoords, GL_DYNAMIC_DRAW); // Update all buffer

        // Colors buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[2]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, batch->vertexBuffer[batch->currentBuffer].vCounter*4*sizeof(unsigned char), batch->vertexBuffer[batch->currentBuffer].colors);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*4*4*batch->vertexBuffer[batch->currentBuffer].elementsCount, batch->vertexBuffer[batch->currentBuffer].colors, GL_DYNAMIC_DRAW);    // Update all buffer

        // NOTE: glMapBuffer() causes sync issue.
        // If GPU is working with this buffer, glMapBuffer() will wait(stall) until GPU to finish its job.
        // To avoid waiting (idle), you can call first glBufferData() with NULL pointer before glMapBuffer().
        // If you do that, the previous data in PBO will be discarded and glMapBuffer() returns a new
        // allocated pointer immediately even if GPU is still working with the previous data.

        // Another option: map the buffer object into client's memory
        // Probably this code could be moved somewhere else...
        // batch->vertexBuffer[batch->currentBuffer].vertices = (float *)glMapBuffer(GL_ARRAY_BUFFER, GL_READ_WRITE);
        // if (batch->vertexBuffer[batch->currentBuffer].vertices)
        // {
            // Update vertex data
        // }
        // glUnmapBuffer(GL_ARRAY_BUFFER);

        // Unbind the current VAO
        if (RLGL.ExtSupported.vao) glBindVertexArray(0);
    }
    //------------------------------------------------------------------------------------------------------------

    // Draw batch vertex buffers (considering VR stereo if required)
    //------------------------------------------------------------------------------------------------------------
    Matrix matProjection = RLGL.State.projection;
    Matrix matModelView = RLGL.State.modelview;

    int eyesCount = 1;
    if (RLGL.State.stereoRender) eyesCount = 2;

    for (int eye = 0; eye < eyesCount; eye++)
    {
        if (eyesCount == 2)
        {
            // Setup current eye viewport (half screen width)
            rlViewport(eye*RLGL.State.framebufferWidth/2, 0, RLGL.State.framebufferWidth/2, RLGL.State.framebufferHeight);

            // Set current eye view offset to modelview matrix
            rlSetMatrixModelview(MatrixMultiply(matModelView, RLGL.State.viewOffsetStereo[eye]));
            // Set current eye projection matrix
            rlSetMatrixProjection(RLGL.State.projectionStereo[eye]);
        }

        // Draw buffers
        if (batch->vertexBuffer[batch->currentBuffer].vCounter > 0)
        {
            // Set current shader and upload current MVP matrix
            glUseProgram(RLGL.State.currentShader.id);

            // Create modelview-projection matrix and upload to shader
            Matrix matMVP = MatrixMultiply(RLGL.State.modelview, RLGL.State.projection);
            glUniformMatrix4fv(RLGL.State.currentShader.locs[SHADER_LOC_MATRIX_MVP], 1, false, MatrixToFloat(matMVP));

            if (RLGL.ExtSupported.vao) glBindVertexArray(batch->vertexBuffer[batch->currentBuffer].vaoId);
            else
            {
                // Bind vertex attrib: position (shader-location = 0)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[0]);
                glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION], 3, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION]);

                // Bind vertex attrib: texcoord (shader-location = 1)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[1]);
                glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01], 2, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01]);

                // Bind vertex attrib: color (shader-location = 3)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[2]);
                glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR], 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR]);

                glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[3]);
            }

            // Setup some default shader values
            glUniform4f(RLGL.State.currentShader.locs[SHADER_LOC_COLOR_DIFFUSE], 1.0f, 1.0f, 1.0f, 1.0f);
            glUniform1i(RLGL.State.currentShader.locs[SHADER_LOC_MAP_DIFFUSE], 0);  // Active default sampler2D: texture0

            // Activate additional sampler textures
            // Those additional textures will be common for all draw calls of the batch
            for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++)
            {
                if (RLGL.State.activeTextureId[i] > 0)
                {
                    glActiveTexture(GL_TEXTURE0 + 1 + i);
                    glBindTexture(GL_TEXTURE_2D, RLGL.State.activeTextureId[i]);
                }
            }

            // Activate default sampler2D texture0 (one texture is always active for default batch shader)
            // NOTE: Batch system accumulates calls by texture0 changes, additional textures are enabled for all the draw calls
            glActiveTexture(GL_TEXTURE0);

            for (int i = 0, vertexOffset = 0; i < batch->drawsCounter; i++)
            {
                // Bind current draw call texture, activated as GL_TEXTURE0 and binded to sampler2D texture0 by default
                glBindTexture(GL_TEXTURE_2D, batch->draws[i].textureId);

                if ((batch->draws[i].mode == RL_LINES) || (batch->draws[i].mode == RL_TRIANGLES)) glDrawArrays(batch->draws[i].mode, vertexOffset, batch->draws[i].vertexCount);
                else
                {
#if defined(GRAPHICS_API_OPENGL_33)
                    // We need to define the number of indices to be processed: quadsCount*6
                    // NOTE: The final parameter tells the GPU the offset in bytes from the
                    // start of the index buffer to the location of the first index to process
                    glDrawElements(GL_TRIANGLES, batch->draws[i].vertexCount/4*6, GL_UNSIGNED_INT, (GLvoid *)(vertexOffset/4*6*sizeof(GLuint)));
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
                    glDrawElements(GL_TRIANGLES, batch->draws[i].vertexCount/4*6, GL_UNSIGNED_SHORT, (GLvoid *)(vertexOffset/4*6*sizeof(GLushort)));
#endif
                }

                vertexOffset += (batch->draws[i].vertexCount + batch->draws[i].vertexAlignment);
            }

            if (!RLGL.ExtSupported.vao)
            {
                glBindBuffer(GL_ARRAY_BUFFER, 0);
                glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
            }

            glBindTexture(GL_TEXTURE_2D, 0);    // Unbind textures
        }

        if (RLGL.ExtSupported.vao) glBindVertexArray(0); // Unbind VAO

        glUseProgram(0);    // Unbind shader program
    }
    //------------------------------------------------------------------------------------------------------------

    // Reset batch buffers
    //------------------------------------------------------------------------------------------------------------
    // Reset vertex counters for next frame
    batch->vertexBuffer[batch->currentBuffer].vCounter = 0;
    batch->vertexBuffer[batch->currentBuffer].tcCounter = 0;
    batch->vertexBuffer[batch->currentBuffer].cCounter = 0;

    // Reset depth for next draw
    batch->currentDepth = -1.0f;

    // Restore projection/modelview matrices
    RLGL.State.projection = matProjection;
    RLGL.State.modelview = matModelView;

    // Reset RLGL.currentBatch->draws array
    for (int i = 0; i < DEFAULT_BATCH_DRAWCALLS; i++)
    {
        batch->draws[i].mode = RL_QUADS;
        batch->draws[i].vertexCount = 0;
        batch->draws[i].textureId = RLGL.State.defaultTextureId;
    }

    // Reset active texture units for next batch
    for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++) RLGL.State.activeTextureId[i] = 0;

    // Reset draws counter to one draw for the batch
    batch->drawsCounter = 1;
    //------------------------------------------------------------------------------------------------------------

    // Change to next buffer in the list (in case of multi-buffering)
    batch->currentBuffer++;
    if (batch->currentBuffer >= batch->buffersCount) batch->currentBuffer = 0;
#endif
}